

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30bed::ShapeMap::modify(ShapeMap *this,Shape *shape,int direction)

{
  int iVar1;
  bool bVar2;
  pointer ppVar3;
  pair<const_Shape_*,_int> pVar4;
  pair<const_Shape_*,_int> local_50;
  _Base_ptr local_38;
  _Self local_30;
  _Self local_28;
  iterator iter;
  Shape *pSStack_18;
  int direction_local;
  Shape *shape_local;
  ShapeMap *this_local;
  
  iter._M_node._4_4_ = direction;
  pSStack_18 = shape;
  shape_local = (Shape *)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
       ::find(&this->
               super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
              ,&stack0xffffffffffffffe8);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
       ::end(&this->
              super_map<const_Shape_*,_int,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
            );
  bVar2 = std::operator!=(&local_28,&local_30);
  iVar1 = iter._M_node._4_4_;
  if (bVar2) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Shape_*const,_int>_>::operator->(&local_28);
    ppVar3->second = iVar1 + ppVar3->second;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Shape_*const,_int>_>::operator->(&local_28);
    if (ppVar3->second == 0) {
      local_38 = local_28._M_node;
      std::
      map<Shape_const*,int,std::less<Shape_const*>,std::allocator<std::pair<Shape_const*const,int>>>
      ::erase_abi_cxx11_((map<Shape_const*,int,std::less<Shape_const*>,std::allocator<std::pair<Shape_const*const,int>>>
                          *)this,(iterator)local_28._M_node);
    }
  }
  else {
    pVar4 = std::make_pair<Shape_const*&,int&>
                      (&stack0xffffffffffffffe8,(int *)((long)&iter._M_node + 4));
    local_50.first = pVar4.first;
    local_50.second = pVar4.second;
    std::
    map<Shape_const*,int,std::less<Shape_const*>,std::allocator<std::pair<Shape_const*const,int>>>::
    insert<std::pair<Shape_const*,int>>
              ((map<Shape_const*,int,std::less<Shape_const*>,std::allocator<std::pair<Shape_const*const,int>>>
                *)this,&local_50);
  }
  return;
}

Assistant:

void modify(const Shape* shape, int direction) {
		auto iter = find(shape);
		if (iter != end()) {
			iter->second += direction;
			if (iter->second == 0) {
				erase(iter);
			}
		}
		else {
			insert(std::make_pair(shape, direction));
		}
	}